

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O3

void handle_result(uv_fs_t *req)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int iVar3;
  uv_fs_t *unaff_RBX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_fs_t stat_req;
  uv_fs_t local_1e0;
  
  local_1e0.data = (void *)(long)req->fs_type;
  if (local_1e0.data == (void *)0x1e) {
    local_1e0.data = (void *)req->result;
    unaff_RBX = req;
    if (local_1e0.data != (void *)0x0) goto LAB_00183dd3;
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&local_1e0,req->path,(uv_fs_cb)0x0);
    uVar2 = local_1e0.statbuf.st_size;
    uVar1 = local_1e0.statbuf.st_mode;
    if (iVar3 != 0) goto LAB_00183de2;
    uv_fs_req_cleanup(&local_1e0);
    iVar3 = uv_fs_stat((uv_loop_t *)0x0,&local_1e0,"test_file_dst",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00183df1;
    if (local_1e0.statbuf.st_size == uVar2) {
      if (local_1e0.statbuf.st_mode == uVar1) {
        uv_fs_req_cleanup(&local_1e0);
        uv_fs_req_cleanup(req);
        result_check_count = result_check_count + 1;
        return;
      }
      goto LAB_00183e0f;
    }
  }
  else {
    handle_result_cold_1();
LAB_00183dd3:
    handle_result_cold_2();
LAB_00183de2:
    handle_result_cold_3();
LAB_00183df1:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_00183e0f:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
          ,0x2c,"fail_cb should not have been called",in_R9,unaff_RBX);
  fflush(_stderr);
  abort();
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT_EQ(req->fs_type, UV_FS_COPYFILE);
  ASSERT_OK(req->result);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT_OK(r);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(stat_req.statbuf.st_size, size);
  ASSERT_EQ(stat_req.statbuf.st_mode, mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}